

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcServerResponse> * __thiscall
kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcServerResponse>::operator=
          (Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcServerResponse> *this,
          Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcServerResponse> *other)

{
  Disposer *pDVar1;
  RpcServerResponse *pRVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  
  pDVar1 = this->disposer;
  pRVar2 = this->ptr;
  uVar3 = *(undefined4 *)((long)&other->disposer + 4);
  uVar4 = *(undefined4 *)&other->ptr;
  uVar5 = *(undefined4 *)((long)&other->ptr + 4);
  *(undefined4 *)&this->disposer = *(undefined4 *)&other->disposer;
  *(undefined4 *)((long)&this->disposer + 4) = uVar3;
  *(undefined4 *)&this->ptr = uVar4;
  *(undefined4 *)((long)&this->ptr + 4) = uVar5;
  other->ptr = (RpcServerResponse *)0x0;
  if (pRVar2 != (RpcServerResponse *)0x0) {
    (**pDVar1->_vptr_Disposer)
              (pDVar1,pRVar2->_vptr_RpcServerResponse[-2] + (long)&pRVar2->_vptr_RpcServerResponse);
  }
  return this;
}

Assistant:

inline Own& operator=(Own&& other) {
    // Move-assingnment operator.

    // Careful, this might own `other`.  Therefore we have to transfer the pointers first, then
    // dispose.
    const Disposer* disposerCopy = disposer;
    T* ptrCopy = ptr;
    disposer = other.disposer;
    ptr = other.ptr;
    other.ptr = nullptr;
    if (ptrCopy != nullptr) {
      disposerCopy->dispose(const_cast<RemoveConst<T>*>(ptrCopy));
    }
    return *this;
  }